

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O1

void __thiscall cilk_fiber::do_post_switch_actions(cilk_fiber *this)

{
  cilk_fiber_proc p_Var1;
  cilk_fiber_proc proc;
  
  p_Var1 = this->m_post_switch_proc;
  if (p_Var1 != (cilk_fiber_proc)0x0) {
    this->m_post_switch_proc = (cilk_fiber_proc)0x0;
    (*p_Var1)(this);
  }
  if (this->m_pending_remove_ref != (cilk_fiber *)0x0) {
    remove_reference(this->m_pending_remove_ref,this->m_pending_pool);
    this->m_pending_remove_ref = (cilk_fiber *)0x0;
    this->m_pending_pool = (cilk_fiber_pool *)0x0;
  }
  return;
}

Assistant:

void cilk_fiber::do_post_switch_actions()
{
    if (m_post_switch_proc) 
    {
        cilk_fiber_proc proc = m_post_switch_proc;
        m_post_switch_proc = NULL;
        proc(this);
    }

    if (m_pending_remove_ref)
    {
        m_pending_remove_ref->remove_reference(m_pending_pool);

        // Even if we don't free it, 
        m_pending_remove_ref = NULL;
        m_pending_pool   = NULL;
    }
}